

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

float __thiscall
nv::FloatImage::applyKernelVertical(FloatImage *this,Kernel1 *k,int x,int y,uint c,WrapMode wm)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  float *pfVar4;
  char *pcVar5;
  uint i;
  ulong uVar6;
  float fVar7;
  
  uVar3 = k->m_windowSize;
  uVar1 = this->m_width;
  uVar2 = this->m_height;
  pfVar4 = this->m_mem;
  fVar7 = 0.0;
  for (uVar6 = 0; uVar3 != uVar6; uVar6 = uVar6 + 1) {
    pcVar5 = index(this,(char *)(ulong)(uint)x,(y - (uVar3 >> 1)) + 1 + (int)uVar6);
    fVar7 = fVar7 + k->m_data[uVar6] * pfVar4[(ulong)((uint)uVar2 * uVar1 * c) + (long)(int)pcVar5];
  }
  return fVar7;
}

Assistant:

float FloatImage::applyKernelVertical(const Kernel1 * k, int x, int y, uint c, WrapMode wm) const
{
	nvDebugCheck(k != NULL);
	
	const uint kernelWindow = k->windowSize();
	const int kernelOffset = int(kernelWindow / 2) - 1;
	
	const float * channel = this->channel(c);

	float sum = 0.0f;
	for (uint i = 0; i < kernelWindow; i++)
	{
		const int src_y = int(y + i) - kernelOffset;
		const int idx = this->index(x, src_y, wm);
		
		sum += k->valueAt(i) * channel[idx];
	}
	
	return sum;
}